

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

int __thiscall Imf_2_5::TiledOutputFile::levelWidth(TiledOutputFile *this,int lx)

{
  Data *pDVar1;
  int iVar2;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  iVar2 = levelSize(pDVar1->minX,pDVar1->maxX,lx,(pDVar1->tileDesc).roundingMode);
  return iVar2;
}

Assistant:

int
TiledOutputFile::levelWidth (int lx) const
{
    try
    {
	int retVal = levelSize (_data->minX, _data->maxX, lx,
			        _data->tileDesc.roundingMode);
        
        return retVal;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling levelWidth() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}